

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobject.cpp
# Opt level: O3

void __thiscall
CorUnix::CSharedMemoryObject::AcquireObjectDestructionLock
          (CSharedMemoryObject *this,CPalThread *pthr)

{
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","AcquireObjectDestructionLock",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0x2a6);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    InternalEnterCriticalSection(pthr,this->m_pcsObjListLock);
    if (PAL_InitializeChakraCoreCalled != false) {
      return;
    }
  }
  abort();
}

Assistant:

void
CSharedMemoryObject::AcquireObjectDestructionLock(
    CPalThread *pthr
    )
{
    _ASSERTE(NULL != pthr);
    
    ENTRY("CSharedMemoryObject::AcquireObjectDestructionLock"
        "(this = %p, pthr = $p)\n",
        this,
        pthr
        );
    
    InternalEnterCriticalSection(pthr, m_pcsObjListLock);

    LOGEXIT("CSharedMemoryObject::AcquireObjectDestructionLock\n");
}